

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

PipelineFor<DynamicCapability> *
capnp::DynamicValue::Pipeline::AsImpl<capnp::DynamicCapability,_(capnp::Kind)7>::apply
          (PipelineFor<DynamicCapability> *__return_storage_ptr__,Pipeline *pipeline)

{
  ClientHook *pCVar1;
  DebugComparison<capnp::DynamicValue::Type_&,_capnp::DynamicValue::Type> _kjCondition;
  Fault f;
  
  _kjCondition.result = pipeline->type == CAPABILITY;
  _kjCondition.right = CAPABILITY;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (_kjCondition.result) {
    pCVar1 = (ClientHook *)(pipeline->field_1).structValue.typeless.hook.disposer;
    (__return_storage_ptr__->super_Client).hook.disposer =
         (Disposer *)(pipeline->field_1).structValue.schema.super_Schema.raw;
    (__return_storage_ptr__->super_Client).hook.ptr = pCVar1;
    (pipeline->field_1).structValue.typeless.hook.disposer = (Disposer *)0x0;
    (__return_storage_ptr__->schema).super_Schema.raw =
         (RawBrandedSchema *)(pipeline->field_1).structValue.typeless.hook.ptr;
  }
  else {
    _kjCondition.left = &pipeline->type;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::DynamicValue::Type&,capnp::DynamicValue::Type>&,char_const(&)[24]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x740,FAILED,"pipeline.type == CAPABILITY",
               "_kjCondition,\"Pipeline type mismatch.\"",&_kjCondition,
               (char (*) [24])"Pipeline type mismatch.");
    (__return_storage_ptr__->super_Client).hook.disposer = (Disposer *)0x0;
    (__return_storage_ptr__->super_Client).hook.ptr = (ClientHook *)0x0;
    (__return_storage_ptr__->schema).super_Schema.raw = (RawBrandedSchema *)0x669df0;
    kj::_::Debug::Fault::~Fault(&f);
  }
  return __return_storage_ptr__;
}

Assistant:

PipelineFor<DynamicCapability> DynamicValue::Pipeline::AsImpl<DynamicCapability>::apply(
    Pipeline& pipeline) {
  KJ_REQUIRE(pipeline.type == CAPABILITY, "Pipeline type mismatch.") {
    return DynamicCapability::Client();
  }
  return kj::mv(pipeline.capabilityValue);
}